

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

void * flatcc_builder_enter_user_frame_ptr(flatcc_builder_t *B,size_t size)

{
  size_t *__s;
  size_t need;
  size_t *psVar1;
  
  need = (size + 7 & 0xfffffffffffffff8) + 8;
  psVar1 = (size_t *)0x0;
  __s = (size_t *)reserve_buffer(B,7,B->user_frame_end,need,0);
  if (__s != (size_t *)0x0) {
    memset(__s,0,need);
    psVar1 = __s + 1;
    *__s = B->user_frame_offset;
    B->user_frame_offset = B->user_frame_end + 8;
    B->user_frame_end = B->user_frame_end + need;
  }
  return psVar1;
}

Assistant:

void *flatcc_builder_enter_user_frame_ptr(flatcc_builder_t *B, size_t size)
{
    size_t *frame;

    size = alignup_size(size, sizeof(size_t)) + sizeof(size_t);

    if (!(frame = reserve_buffer(B, flatcc_builder_alloc_us, B->user_frame_end, size, 0))) {
        return 0;
    }
    memset(frame, 0, size);
    *frame++ = B->user_frame_offset;
    B->user_frame_offset = B->user_frame_end + sizeof(size_t);
    B->user_frame_end += size;
    return frame;
}